

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_Mesh::Read_2(ON_Mesh *this,int vcount,ON_BinaryArchive *file)

{
  ON_3fPoint *src;
  ON_3fVector *src_00;
  ON_2fPoint *src_01;
  ON_SurfaceCurvature *src_02;
  ON_Color *src_03;
  bool bVar1;
  endian eVar2;
  ulong new_capacity;
  bool bFailedCRC;
  size_t sz;
  bool local_39;
  size_t local_38;
  
  eVar2 = ON_BinaryArchive::Endian(file);
  if (vcount < 1) {
    bVar1 = true;
  }
  else {
    local_38 = 0;
    bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_38);
    new_capacity = (ulong)(uint)vcount;
    if (local_38 != 0 && bVar1) {
      if (local_38 == new_capacity * 0xc) {
        ON_SimpleArray<ON_3fPoint>::SetCapacity
                  (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,new_capacity);
        bVar1 = ON_BinaryArchive::ReadCompressedBuffer
                          (file,local_38,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a,&local_39)
        ;
        if ((bVar1) && (vcount <= (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity)) {
          (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count = vcount;
        }
      }
      else {
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x74a,"","ON_Mesh::Read - compressed vertex point buffer size is wrong.");
      }
    }
    local_38 = 0;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_38);
    }
    if ((local_38 != 0 & bVar1) == 1) {
      if (local_38 == new_capacity * 0xc) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,new_capacity);
        bVar1 = ON_BinaryArchive::ReadCompressedBuffer
                          (file,local_38,(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a,&local_39
                          );
        if ((bVar1) && (vcount <= (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity)) {
          (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count = vcount;
        }
      }
      else {
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x75b,"","ON_Mesh::Read - compressed vertex normal buffer size is wrong.");
      }
    }
    local_38 = 0;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_38);
    }
    if ((local_38 != 0 & bVar1) == 1) {
      if (local_38 == new_capacity * 8) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity
                  (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,new_capacity);
        bVar1 = ON_BinaryArchive::ReadCompressedBuffer
                          (file,local_38,(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a,&local_39)
        ;
        if ((bVar1) && (vcount <= (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity)) {
          (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count = vcount;
        }
      }
      else {
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x76c,"","ON_Mesh::Read - compressed texture coordinate buffer size is wrong.");
      }
    }
    local_38 = 0;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_38);
    }
    if ((local_38 != 0 & bVar1) == 1) {
      if (local_38 == new_capacity << 4) {
        ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&this->m_K,new_capacity);
        bVar1 = ON_BinaryArchive::ReadCompressedBuffer(file,local_38,(this->m_K).m_a,&local_39);
        if ((bVar1) && (vcount <= (this->m_K).m_capacity)) {
          (this->m_K).m_count = vcount;
        }
      }
      else {
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x77d,"","ON_Mesh::Read - compressed vertex curvature buffer size is wrong.");
      }
    }
    local_38 = 0;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(file,&local_38);
    }
    if ((local_38 != 0 & bVar1) == 1) {
      if (local_38 == new_capacity * 4) {
        ON_SimpleArray<ON_Color>::SetCapacity(&this->m_C,new_capacity);
        bVar1 = ON_BinaryArchive::ReadCompressedBuffer(file,local_38,(this->m_C).m_a,&local_39);
        if ((bVar1) && (vcount <= (this->m_C).m_capacity)) {
          (this->m_C).m_count = vcount;
        }
      }
      else {
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x78e,"","ON_Mesh::Read - compressed vertex color buffer size is wrong.");
      }
    }
    if (eVar2 == big_endian) {
      src = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder
                ((long)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count * 3,4,src,src);
      src_00 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      ON_BinaryArchive::ToggleByteOrder
                ((long)(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count * 3,4,src_00,src_00);
      src_01 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder
                ((long)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count * 2,4,src_01,src_01);
      src_02 = (this->m_K).m_a;
      ON_BinaryArchive::ToggleByteOrder((long)(this->m_K).m_count * 2,8,src_02,src_02);
      src_03 = (this->m_C).m_a;
      ON_BinaryArchive::ToggleByteOrder((long)(this->m_C).m_count * 3,4,src_03,src_03);
    }
  }
  return bVar1;
}

Assistant:

bool ON_Mesh::Read_2( int vcount, ON_BinaryArchive& file )
{
  // common to all 2.x formats (compressed)
  const ON::endian e = file.Endian();

  bool rc = true;


  if ( vcount > 0 ) 
  {
    size_t sz = 0;
    bool bFailedCRC;

    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_V[0]) )
      {
        m_V.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_V.Array(),&bFailedCRC);
        if (rc) m_V.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed vertex point buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }

    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_N[0]) )
      {
        m_N.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_N.Array(),&bFailedCRC );
        if (rc) m_N.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed vertex normal buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }
    
    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_T[0]) )
      {
        m_T.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_T.Array(),&bFailedCRC );
        if (rc) m_T.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed texture coordinate buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }
    
    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_K[0]) )
      {
        m_K.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_K.Array(),&bFailedCRC );
        if (rc) m_K.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed vertex curvature buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }
    
    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_C[0]) )
      {
        m_C.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_C.Array(),&bFailedCRC );
        if (rc) m_C.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed vertex color buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }
    
    if (e == ON::endian::big_endian)
    {
      // This code assumes sizeof(ON_Color)=4, sizeof(float)=4 
      // and sizeof(double)=8.
      // If this is not the case, then changing the 4's and 8's below
      // will not work.  You will have to read the compressed
      // information into temporary arrays of 4 byte floats/8 byte doubles
      // and then convert those numbers to whatever is stored in the
      // m_V[], m_N[], m_T[], m_K[] and m_C[] arrays/
      file.ToggleByteOrder( m_V.Count()*3, 4, m_V.Array(), (void*)m_V.Array() );
      file.ToggleByteOrder( m_N.Count()*3, 4, m_N.Array(), (void*)m_N.Array() );
      file.ToggleByteOrder( m_T.Count()*2, 4, m_T.Array(), (void*)m_T.Array() );
      file.ToggleByteOrder( m_K.Count()*2, 8, m_K.Array(), (void*)m_K.Array() );
      file.ToggleByteOrder( m_C.Count()*3, 4, m_C.Array(), (void*)m_C.Array() );
    }
  }

  return rc;
}